

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int *piVar24;
  undefined8 uVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  undefined1 (*pauVar29) [64];
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [16];
  long lVar32;
  undefined4 *puVar33;
  size_t *psVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  
  iVar1 = B->elempack;
  psVar34 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar34 = &B->cstep;
  }
  iVar2 = (int)*psVar34;
  lVar40 = 0;
  lVar35 = (long)iVar2;
  lVar37 = (long)j;
  if (0xb < max_jj) {
    lVar40 = (long)(iVar2 * k);
    lVar36 = lVar37 * 0x40 + lVar40 * 4 + 0x2c0;
    lVar38 = lVar37 * 0x20 + lVar40 * 4 + 0x160;
    lVar26 = lVar37 * 0x10 + lVar40 * 4 + 0xb0;
    lVar32 = lVar40 * 4 + lVar37 * 4 + 0x20;
    lVar27 = 0;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar29 = (undefined1 (*) [64])((long)B->data + lVar36);
          iVar28 = 0xf;
          do {
            auVar45 = vunpcklps_avx512f(pauVar29[-0xb],pauVar29[-10]);
            auVar46 = vunpckhps_avx512f(pauVar29[-0xb],pauVar29[-10]);
            auVar47 = vunpcklps_avx512f(pauVar29[-9],pauVar29[-8]);
            auVar48 = vunpckhps_avx512f(pauVar29[-9],pauVar29[-8]);
            auVar49 = vunpcklps_avx512f(pauVar29[-7],pauVar29[-6]);
            auVar50 = vunpckhps_avx512f(pauVar29[-7],pauVar29[-6]);
            auVar51 = vunpcklps_avx512f(pauVar29[-5],pauVar29[-4]);
            auVar52 = vunpckhps_avx512f(pauVar29[-5],pauVar29[-4]);
            auVar53 = vunpcklps_avx512f(pauVar29[-3],pauVar29[-2]);
            auVar54 = vunpckhps_avx512f(pauVar29[-3],pauVar29[-2]);
            auVar55 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
            auVar56 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
            auVar57 = vunpcklpd_avx512f(auVar45,auVar47);
            auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
            auVar47 = vunpcklpd_avx512f(auVar46,auVar48);
            auVar46 = vunpckhpd_avx512f(auVar46,auVar48);
            auVar48 = vunpcklpd_avx512f(auVar49,auVar51);
            auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
            auVar51 = vunpcklpd_avx512f(auVar50,auVar52);
            auVar50 = vunpckhpd_avx512f(auVar50,auVar52);
            auVar52 = vunpcklpd_avx512f(auVar53,auVar55);
            auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
            auVar55 = vunpcklpd_avx512f(auVar54,auVar56);
            auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
            auVar56 = vshuff64x2_avx512f(auVar57,auVar48,0x88);
            auVar58 = vshuff64x2_avx512f(auVar52,auVar45,0x88);
            auVar59 = vshuff64x2_avx512f(auVar49,auVar53,0x88);
            auVar60 = vshuff64x2_avx512f(auVar47,auVar51,0x88);
            auVar61 = vshuff64x2_avx512f(auVar55,auVar46,0x88);
            auVar62 = vshuff64x2_avx512f(auVar50,auVar54,0x88);
            auVar48 = vshuff64x2_avx512f(auVar57,auVar48,0xdd);
            auVar45 = vshuff64x2_avx512f(auVar52,auVar45,0xdd);
            auVar49 = vshuff64x2_avx512f(auVar49,auVar53,0xdd);
            auVar47 = vshuff64x2_avx512f(auVar47,auVar51,0xdd);
            auVar46 = vshuff64x2_avx512f(auVar55,auVar46,0xdd);
            auVar50 = vshuff64x2_avx512f(auVar50,auVar54,0xdd);
            auVar51 = vshuff64x2_avx512f(auVar56,auVar58,0x88);
            auVar52 = vshuff64x2_avx512f(auVar59,auVar60,0x88);
            auVar53 = vshuff64x2_avx512f(auVar61,auVar62,0x88);
            auVar54 = vshuff64x2_avx512f(auVar48,auVar45,0x88);
            auVar55 = vshuff64x2_avx512f(auVar49,auVar47,0x88);
            auVar57 = vshuff64x2_avx512f(auVar46,auVar50,0x88);
            auVar56 = vshuff64x2_avx512f(auVar56,auVar58,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar59,auVar60,0xdd);
            auVar59 = vshuff64x2_avx512f(auVar61,auVar62,0xdd);
            auVar45 = vshuff64x2_avx512f(auVar48,auVar45,0xdd);
            auVar47 = vshuff64x2_avx512f(auVar49,auVar47,0xdd);
            auVar46 = vshuff64x2_avx512f(auVar46,auVar50,0xdd);
            BT->data = (void *)auVar51._0_8_;
            BT->refcount = (int *)auVar51._8_8_;
            BT->elemsize = auVar51._16_8_;
            BT->elempack = auVar51._24_4_;
            *(int *)&BT->field_0x1c = auVar51._28_4_;
            BT->allocator = (Allocator *)auVar51._32_8_;
            BT->dims = auVar51._40_4_;
            BT->w = auVar51._44_4_;
            BT->h = auVar51._48_4_;
            BT->d = auVar51._52_4_;
            BT->c = auVar51._56_4_;
            *(int *)&BT->field_0x3c = auVar51._60_4_;
            *(undefined1 (*) [64])&BT->cstep = auVar52;
            *(undefined1 (*) [64])&BT[1].c = auVar53;
            *(undefined1 (*) [64])&BT[2].h = auVar54;
            *(undefined1 (*) [64])&BT[3].dims = auVar55;
            *(undefined1 (*) [64])&BT[4].allocator = auVar57;
            *(undefined1 (*) [64])&BT[5].elempack = auVar56;
            *(undefined1 (*) [64])&BT[6].elemsize = auVar58;
            BT[7].refcount = (int *)auVar59._0_8_;
            BT[7].elemsize = auVar59._8_8_;
            BT[7].elempack = auVar59._16_4_;
            *(int *)&BT[7].field_0x1c = auVar59._20_4_;
            BT[7].allocator = (Allocator *)auVar59._24_8_;
            BT[7].dims = auVar59._32_4_;
            BT[7].w = auVar59._36_4_;
            BT[7].h = auVar59._40_4_;
            BT[7].d = auVar59._44_4_;
            BT[7].c = auVar59._48_4_;
            *(int *)&BT[7].field_0x3c = auVar59._52_4_;
            BT[7].cstep = auVar59._56_8_;
            BT[8].data = (void *)auVar45._0_8_;
            BT[8].refcount = (int *)auVar45._8_8_;
            BT[8].elemsize = auVar45._16_8_;
            BT[8].elempack = auVar45._24_4_;
            *(int *)&BT[8].field_0x1c = auVar45._28_4_;
            BT[8].allocator = (Allocator *)auVar45._32_8_;
            BT[8].dims = auVar45._40_4_;
            BT[8].w = auVar45._44_4_;
            BT[8].h = auVar45._48_4_;
            BT[8].d = auVar45._52_4_;
            BT[8].c = auVar45._56_4_;
            *(int *)&BT[8].field_0x3c = auVar45._60_4_;
            *(undefined1 (*) [64])&BT[8].cstep = auVar47;
            *(undefined1 (*) [64])&BT[9].c = auVar46;
            BT = (Mat *)&BT[10].h;
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
            iVar28 = iVar28 + 0x10;
          } while (iVar28 < max_kk);
          goto LAB_00491781;
        }
      }
      else {
LAB_00491781:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_00491a79;
          pauVar30 = (undefined1 (*) [32])((long)B->data + lVar38);
          iVar28 = 7;
          do {
            auVar19 = vunpcklps_avx(pauVar30[-0xb],pauVar30[-10]);
            auVar5 = vunpckhps_avx(pauVar30[-0xb],pauVar30[-10]);
            auVar20 = vunpcklps_avx(pauVar30[-9],pauVar30[-8]);
            auVar6 = vunpckhps_avx(pauVar30[-9],pauVar30[-8]);
            auVar21 = vunpcklps_avx(pauVar30[-7],pauVar30[-6]);
            auVar7 = vunpckhps_avx(pauVar30[-7],pauVar30[-6]);
            auVar22 = vunpcklps_avx(pauVar30[-5],pauVar30[-4]);
            auVar8 = vunpckhps_avx(pauVar30[-5],pauVar30[-4]);
            auVar23 = vunpcklps_avx(pauVar30[-3],pauVar30[-2]);
            auVar9 = vunpckhps_avx(pauVar30[-3],pauVar30[-2]);
            auVar43 = vunpcklps_avx(pauVar30[-1],*pauVar30);
            auVar10 = vunpckhps_avx(pauVar30[-1],*pauVar30);
            auVar16 = vunpcklpd_avx(auVar19,auVar20);
            auVar19 = vunpckhpd_avx(auVar19,auVar20);
            auVar20 = vunpcklpd_avx(auVar5,auVar6);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            auVar68 = vunpcklpd_avx(auVar21,auVar22);
            auVar6 = vunpckhpd_avx(auVar21,auVar22);
            auVar21 = vunpcklpd_avx(auVar7,auVar8);
            auVar7 = vunpckhpd_avx(auVar7,auVar8);
            auVar22 = vunpcklpd_avx(auVar23,auVar43);
            auVar8 = vunpckhpd_avx(auVar23,auVar43);
            auVar23 = vunpcklpd_avx(auVar9,auVar10);
            auVar9 = vunpckhpd_avx(auVar9,auVar10);
            auVar64 = auVar68._0_16_;
            auVar66 = auVar22._0_16_;
            auVar63 = auVar19._0_16_;
            auVar69._16_16_ = auVar8._0_16_;
            auVar69._0_16_ = auVar6._0_16_;
            auVar67 = auVar20._0_16_;
            auVar65 = auVar21._0_16_;
            auVar43 = vinsertf32x4_avx512vl(auVar23,auVar5._0_16_,1);
            auVar44 = vinsertf32x4_avx512vl(auVar7,auVar9._0_16_,1);
            auVar10 = vperm2f128_avx(auVar16,auVar68,0x31);
            auVar19 = vperm2f128_avx(auVar22,auVar19,0x31);
            auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
            auVar8 = vperm2f128_avx(auVar20,auVar21,0x31);
            auVar5 = vperm2f128_avx(auVar23,auVar5,0x31);
            auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
            BT->data = (void *)SUB168(auVar16._0_16_,0);
            BT->refcount = (int *)SUB168(auVar16._0_16_,8);
            BT->elemsize = auVar64._0_8_;
            BT->elempack = auVar64._8_4_;
            *(int *)&BT->field_0x1c = auVar64._12_4_;
            BT->allocator = (Allocator *)auVar66._0_8_;
            BT->dims = auVar66._8_4_;
            BT->w = auVar66._12_4_;
            BT->h = auVar63._0_4_;
            BT->d = auVar63._4_4_;
            BT->c = auVar63._8_4_;
            *(int *)&BT->field_0x3c = auVar63._12_4_;
            *(undefined1 (*) [32])&BT->cstep = auVar69;
            BT[1].elempack = auVar67._0_4_;
            *(int *)&BT[1].field_0x1c = auVar67._4_4_;
            BT[1].allocator = (Allocator *)auVar67._8_8_;
            BT[1].dims = auVar65._0_4_;
            BT[1].w = auVar65._4_4_;
            BT[1].h = auVar65._8_4_;
            BT[1].d = auVar65._12_4_;
            *(undefined1 (*) [32])&BT[1].c = auVar43;
            BT[2].elemsize = auVar44._0_8_;
            BT[2].elempack = auVar44._8_4_;
            *(int *)&BT[2].field_0x1c = auVar44._12_4_;
            BT[2].allocator = (Allocator *)auVar44._16_8_;
            BT[2].dims = auVar44._24_4_;
            BT[2].w = auVar44._28_4_;
            *(undefined1 (*) [32])&BT[2].h = auVar10;
            BT[3].refcount = (int *)auVar19._0_8_;
            BT[3].elemsize = auVar19._8_8_;
            BT[3].elempack = auVar19._16_4_;
            *(int *)&BT[3].field_0x1c = auVar19._20_4_;
            BT[3].allocator = (Allocator *)auVar19._24_8_;
            BT[3].dims = auVar6._0_4_;
            BT[3].w = auVar6._4_4_;
            BT[3].h = auVar6._8_4_;
            BT[3].d = auVar6._12_4_;
            BT[3].c = auVar6._16_4_;
            *(int *)&BT[3].field_0x3c = auVar6._20_4_;
            BT[3].cstep = auVar6._24_8_;
            BT[4].data = (void *)auVar8._0_8_;
            BT[4].refcount = (int *)auVar8._8_8_;
            BT[4].elemsize = auVar8._16_8_;
            BT[4].elempack = auVar8._24_4_;
            *(int *)&BT[4].field_0x1c = auVar8._28_4_;
            BT[4].allocator = (Allocator *)auVar5._0_8_;
            BT[4].dims = auVar5._8_4_;
            BT[4].w = auVar5._12_4_;
            BT[4].h = auVar5._16_4_;
            BT[4].d = auVar5._20_4_;
            BT[4].c = auVar5._24_4_;
            *(int *)&BT[4].field_0x3c = auVar5._28_4_;
            *(undefined1 (*) [32])&BT[4].cstep = auVar7;
            BT = (Mat *)&BT[5].elempack;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + (long)(iVar2 * 8) * 4);
            iVar28 = iVar28 + 8;
          } while (iVar28 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_00491a79;
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar26);
          iVar28 = 3;
          do {
            auVar63 = vunpcklps_avx(pauVar31[-0xb],pauVar31[-10]);
            auVar66 = vunpcklps_avx(pauVar31[-9],pauVar31[-8]);
            auVar64 = vunpckhps_avx(pauVar31[-0xb],pauVar31[-10]);
            auVar65 = vunpckhps_avx(pauVar31[-9],pauVar31[-8]);
            auVar11 = vunpcklpd_avx(auVar63,auVar66);
            auVar63 = vunpckhpd_avx(auVar63,auVar66);
            auVar12 = vunpcklpd_avx(auVar64,auVar65);
            auVar64 = vunpckhpd_avx(auVar64,auVar65);
            auVar65 = vunpcklps_avx(pauVar31[-7],pauVar31[-6]);
            auVar17 = vunpcklps_avx(pauVar31[-5],pauVar31[-4]);
            auVar66 = vunpckhps_avx(pauVar31[-7],pauVar31[-6]);
            auVar67 = vunpckhps_avx(pauVar31[-5],pauVar31[-4]);
            auVar13 = vunpcklpd_avx(auVar65,auVar17);
            auVar65 = vunpckhpd_avx(auVar65,auVar17);
            auVar14 = vunpcklpd_avx(auVar66,auVar67);
            auVar66 = vunpckhpd_avx(auVar66,auVar67);
            auVar67 = vunpcklps_avx(pauVar31[-3],pauVar31[-2]);
            auVar18 = vunpcklps_avx(pauVar31[-1],*pauVar31);
            auVar17 = vunpckhps_avx(pauVar31[-3],pauVar31[-2]);
            auVar4 = vunpckhps_avx(pauVar31[-1],*pauVar31);
            auVar15 = vunpcklpd_avx(auVar67,auVar18);
            auVar67 = vunpckhpd_avx(auVar67,auVar18);
            auVar18 = vunpcklpd_avx(auVar17,auVar4);
            auVar17 = vunpckhpd_avx(auVar17,auVar4);
            BT->data = (void *)auVar11._0_8_;
            BT->refcount = (int *)auVar11._8_8_;
            BT->elemsize = auVar13._0_8_;
            BT->elempack = auVar13._8_4_;
            *(int *)&BT->field_0x1c = auVar13._12_4_;
            BT->allocator = (Allocator *)auVar15._0_8_;
            BT->dims = auVar15._8_4_;
            BT->w = auVar15._12_4_;
            BT->h = auVar63._0_4_;
            BT->d = auVar63._4_4_;
            BT->c = auVar63._8_4_;
            *(int *)&BT->field_0x3c = auVar63._12_4_;
            *(undefined1 (*) [16])&BT->cstep = auVar65;
            BT[1].refcount = (int *)auVar67._0_8_;
            BT[1].elemsize = auVar67._8_8_;
            BT[1].elempack = auVar12._0_4_;
            *(int *)&BT[1].field_0x1c = auVar12._4_4_;
            BT[1].allocator = (Allocator *)auVar12._8_8_;
            BT[1].dims = auVar14._0_4_;
            BT[1].w = auVar14._4_4_;
            BT[1].h = auVar14._8_4_;
            BT[1].d = auVar14._12_4_;
            BT[1].c = auVar18._0_4_;
            *(int *)&BT[1].field_0x3c = auVar18._4_4_;
            BT[1].cstep = auVar18._8_8_;
            BT[2].data = (void *)auVar64._0_8_;
            BT[2].refcount = (int *)auVar64._8_8_;
            BT[2].elemsize = auVar66._0_8_;
            BT[2].elempack = auVar66._8_4_;
            *(int *)&BT[2].field_0x1c = auVar66._12_4_;
            BT[2].allocator = (Allocator *)auVar17._0_8_;
            BT[2].dims = auVar17._8_4_;
            BT[2].w = auVar17._12_4_;
            BT = (Mat *)&BT[2].h;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)(iVar2 * 4) * 4);
            iVar28 = iVar28 + 4;
          } while (iVar28 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar32);
          iVar28 = max_kk;
          do {
            piVar24 = *(int **)(pauVar31[-2] + 8);
            BT->data = *(void **)pauVar31[-2];
            BT->refcount = piVar24;
            uVar25 = *(undefined8 *)(pauVar31[-1] + 8);
            BT->elemsize = *(size_t *)pauVar31[-1];
            *(undefined8 *)&BT->elempack = uVar25;
            *(undefined1 (*) [16])&BT->allocator = *pauVar31;
            BT = (Mat *)&BT->h;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + lVar35 * 4);
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
      }
LAB_00491a79:
      lVar40 = lVar27 + 0xc;
      uVar41 = lVar27 + 0x17;
      lVar36 = lVar36 + 0x300;
      lVar38 = lVar38 + 0x180;
      lVar26 = lVar26 + 0xc0;
      lVar32 = lVar32 + 0x30;
      lVar27 = lVar40;
    } while (uVar41 < (uint)max_jj);
  }
  lVar27 = (long)max_jj;
  if ((int)lVar40 + 7 < max_jj) {
    lVar32 = (long)(iVar2 * k);
    lVar26 = (long)(int)lVar40;
    lVar40 = lVar26 + lVar37;
    lVar42 = lVar40 * 0x40 + lVar32 * 4 + 0x1c0;
    lVar36 = lVar40 * 0x20 + lVar32 * 4 + 0xe0;
    lVar38 = lVar40 * 0x10 + lVar32 * 4 + 0x70;
    lVar32 = lVar37 * 4 + lVar26 * 4 + lVar32 * 4 + 0x10;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar29 = (undefined1 (*) [64])((long)B->data + lVar42);
          iVar28 = 0xf;
          do {
            auVar45 = vunpcklps_avx512f(pauVar29[-7],pauVar29[-6]);
            auVar46 = vunpckhps_avx512f(pauVar29[-7],pauVar29[-6]);
            auVar47 = vunpcklps_avx512f(pauVar29[-5],pauVar29[-4]);
            auVar48 = vunpckhps_avx512f(pauVar29[-5],pauVar29[-4]);
            auVar49 = vunpcklps_avx512f(pauVar29[-3],pauVar29[-2]);
            auVar50 = vunpckhps_avx512f(pauVar29[-3],pauVar29[-2]);
            auVar51 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
            auVar52 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
            auVar53 = vunpcklpd_avx512f(auVar45,auVar47);
            auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
            auVar47 = vunpcklpd_avx512f(auVar46,auVar48);
            auVar46 = vunpckhpd_avx512f(auVar46,auVar48);
            auVar48 = vunpcklpd_avx512f(auVar49,auVar51);
            auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
            auVar51 = vunpcklpd_avx512f(auVar50,auVar52);
            auVar50 = vunpckhpd_avx512f(auVar50,auVar52);
            auVar52 = vshuff64x2_avx512f(auVar53,auVar48,0x88);
            auVar54 = vshuff64x2_avx512f(auVar45,auVar49,0x88);
            auVar55 = vshuff64x2_avx512f(auVar47,auVar51,0x88);
            auVar56 = vshuff64x2_avx512f(auVar46,auVar50,0x88);
            auVar48 = vshuff64x2_avx512f(auVar53,auVar48,0xdd);
            auVar45 = vshuff64x2_avx512f(auVar45,auVar49,0xdd);
            auVar47 = vshuff64x2_avx512f(auVar47,auVar51,0xdd);
            auVar46 = vshuff64x2_avx512f(auVar46,auVar50,0xdd);
            auVar49 = vshuff64x2_avx512f(auVar52,auVar54,0x88);
            auVar50 = vshuff64x2_avx512f(auVar55,auVar56,0x88);
            auVar51 = vshuff64x2_avx512f(auVar48,auVar45,0x88);
            auVar53 = vshuff64x2_avx512f(auVar47,auVar46,0x88);
            auVar52 = vshuff64x2_avx512f(auVar52,auVar54,0xdd);
            auVar54 = vshuff64x2_avx512f(auVar55,auVar56,0xdd);
            auVar45 = vshuff64x2_avx512f(auVar48,auVar45,0xdd);
            auVar46 = vshuff64x2_avx512f(auVar47,auVar46,0xdd);
            BT->data = (void *)auVar49._0_8_;
            BT->refcount = (int *)auVar49._8_8_;
            BT->elemsize = auVar49._16_8_;
            BT->elempack = auVar49._24_4_;
            *(int *)&BT->field_0x1c = auVar49._28_4_;
            BT->allocator = (Allocator *)auVar49._32_8_;
            BT->dims = auVar49._40_4_;
            BT->w = auVar49._44_4_;
            BT->h = auVar49._48_4_;
            BT->d = auVar49._52_4_;
            BT->c = auVar49._56_4_;
            *(int *)&BT->field_0x3c = auVar49._60_4_;
            *(undefined1 (*) [64])&BT->cstep = auVar50;
            *(undefined1 (*) [64])&BT[1].c = auVar51;
            *(undefined1 (*) [64])&BT[2].h = auVar53;
            *(undefined1 (*) [64])&BT[3].dims = auVar52;
            *(undefined1 (*) [64])&BT[4].allocator = auVar54;
            *(undefined1 (*) [64])&BT[5].elempack = auVar45;
            *(undefined1 (*) [64])&BT[6].elemsize = auVar46;
            BT = (Mat *)&BT[7].refcount;
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
            iVar28 = iVar28 + 0x10;
          } while (iVar28 < max_kk);
          goto LAB_00491ced;
        }
      }
      else {
LAB_00491ced:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_00491ef3;
          pauVar30 = (undefined1 (*) [32])((long)B->data + lVar36);
          iVar28 = 7;
          do {
            auVar19 = vunpcklps_avx(pauVar30[-7],pauVar30[-6]);
            auVar5 = vunpckhps_avx(pauVar30[-7],pauVar30[-6]);
            auVar10 = vunpcklps_avx(pauVar30[-5],pauVar30[-4]);
            auVar6 = vunpckhps_avx(pauVar30[-5],pauVar30[-4]);
            auVar20 = vunpcklps_avx(pauVar30[-3],pauVar30[-2]);
            auVar7 = vunpckhps_avx(pauVar30[-3],pauVar30[-2]);
            auVar68 = vunpcklps_avx(pauVar30[-1],*pauVar30);
            auVar8 = vunpckhps_avx(pauVar30[-1],*pauVar30);
            auVar9 = vunpcklpd_avx(auVar19,auVar10);
            auVar19 = vunpckhpd_avx(auVar19,auVar10);
            auVar10 = vunpcklpd_avx(auVar5,auVar6);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            auVar16 = vunpcklpd_avx(auVar20,auVar68);
            auVar6 = vunpckhpd_avx(auVar20,auVar68);
            auVar20 = vunpcklpd_avx(auVar7,auVar8);
            auVar7 = vunpckhpd_avx(auVar7,auVar8);
            auVar65 = auVar16._0_16_;
            auVar64 = auVar19._0_16_;
            auVar66 = auVar6._0_16_;
            auVar68._16_16_ = auVar20._0_16_;
            auVar68._0_16_ = auVar10._0_16_;
            auVar63 = auVar5._0_16_;
            auVar67 = auVar7._0_16_;
            auVar8 = vperm2f128_avx(auVar9,auVar16,0x31);
            auVar19 = vperm2f128_avx(auVar19,auVar6,0x31);
            auVar6 = vperm2f128_avx(auVar10,auVar20,0x31);
            auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
            BT->data = (void *)SUB168(auVar9._0_16_,0);
            BT->refcount = (int *)SUB168(auVar9._0_16_,8);
            BT->elemsize = auVar65._0_8_;
            BT->elempack = auVar65._8_4_;
            *(int *)&BT->field_0x1c = auVar65._12_4_;
            BT->allocator = (Allocator *)auVar64._0_8_;
            BT->dims = auVar64._8_4_;
            BT->w = auVar64._12_4_;
            BT->h = auVar66._0_4_;
            BT->d = auVar66._4_4_;
            BT->c = auVar66._8_4_;
            *(int *)&BT->field_0x3c = auVar66._12_4_;
            *(undefined1 (*) [32])&BT->cstep = auVar68;
            BT[1].elempack = auVar63._0_4_;
            *(int *)&BT[1].field_0x1c = auVar63._4_4_;
            BT[1].allocator = (Allocator *)auVar63._8_8_;
            BT[1].dims = auVar67._0_4_;
            BT[1].w = auVar67._4_4_;
            BT[1].h = auVar67._8_4_;
            BT[1].d = auVar67._12_4_;
            *(undefined1 (*) [32])&BT[1].c = auVar8;
            BT[2].elemsize = auVar19._0_8_;
            BT[2].elempack = auVar19._8_4_;
            *(int *)&BT[2].field_0x1c = auVar19._12_4_;
            BT[2].allocator = (Allocator *)auVar19._16_8_;
            BT[2].dims = auVar19._24_4_;
            BT[2].w = auVar19._28_4_;
            *(undefined1 (*) [32])&BT[2].h = auVar6;
            BT[3].refcount = (int *)auVar5._0_8_;
            BT[3].elemsize = auVar5._8_8_;
            BT[3].elempack = auVar5._16_4_;
            *(int *)&BT[3].field_0x1c = auVar5._20_4_;
            BT[3].allocator = (Allocator *)auVar5._24_8_;
            BT = (Mat *)&BT[3].dims;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + (long)(iVar2 * 8) * 4);
            iVar28 = iVar28 + 8;
          } while (iVar28 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_00491ef3;
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar38);
          iVar28 = 3;
          do {
            auVar63 = vunpcklps_avx(pauVar31[-7],pauVar31[-6]);
            auVar66 = vunpcklps_avx(pauVar31[-5],pauVar31[-4]);
            auVar64 = vunpckhps_avx(pauVar31[-7],pauVar31[-6]);
            auVar65 = vunpckhps_avx(pauVar31[-5],pauVar31[-4]);
            auVar17 = vunpcklpd_avx(auVar63,auVar66);
            auVar63 = vunpckhpd_avx(auVar63,auVar66);
            auVar4 = vunpcklpd_avx(auVar64,auVar65);
            auVar64 = vunpckhpd_avx(auVar64,auVar65);
            auVar65 = vunpcklps_avx(pauVar31[-3],pauVar31[-2]);
            auVar12 = vunpcklps_avx(pauVar31[-1],*pauVar31);
            auVar66 = vunpckhps_avx(pauVar31[-3],pauVar31[-2]);
            auVar67 = vunpckhps_avx(pauVar31[-1],*pauVar31);
            auVar11 = vunpcklpd_avx(auVar65,auVar12);
            auVar65 = vunpckhpd_avx(auVar65,auVar12);
            auVar12 = vunpcklpd_avx(auVar66,auVar67);
            auVar66 = vunpckhpd_avx(auVar66,auVar67);
            BT->data = (void *)auVar17._0_8_;
            BT->refcount = (int *)auVar17._8_8_;
            BT->elemsize = auVar11._0_8_;
            BT->elempack = auVar11._8_4_;
            *(int *)&BT->field_0x1c = auVar11._12_4_;
            BT->allocator = (Allocator *)auVar63._0_8_;
            BT->dims = auVar63._8_4_;
            BT->w = auVar63._12_4_;
            BT->h = auVar65._0_4_;
            BT->d = auVar65._4_4_;
            BT->c = auVar65._8_4_;
            *(int *)&BT->field_0x3c = auVar65._12_4_;
            *(undefined1 (*) [16])&BT->cstep = auVar4;
            BT[1].refcount = (int *)auVar12._0_8_;
            BT[1].elemsize = auVar12._8_8_;
            BT[1].elempack = auVar64._0_4_;
            *(int *)&BT[1].field_0x1c = auVar64._4_4_;
            BT[1].allocator = (Allocator *)auVar64._8_8_;
            BT[1].dims = auVar66._0_4_;
            BT[1].w = auVar66._4_4_;
            BT[1].h = auVar66._8_4_;
            BT[1].d = auVar66._12_4_;
            BT = (Mat *)&BT[1].c;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)(iVar2 * 4) * 4);
            iVar28 = iVar28 + 4;
          } while (iVar28 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar32);
          iVar28 = max_kk;
          do {
            piVar24 = *(int **)(pauVar31[-1] + 8);
            BT->data = *(void **)pauVar31[-1];
            BT->refcount = piVar24;
            *(undefined1 (*) [16])&BT->elemsize = *pauVar31;
            BT = (Mat *)&BT->allocator;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + lVar35 * 4);
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
      }
LAB_00491ef3:
      lVar40 = lVar26 + 8;
      lVar42 = lVar42 + 0x200;
      lVar36 = lVar36 + 0x100;
      lVar38 = lVar38 + 0x80;
      lVar32 = lVar32 + 0x20;
      bVar3 = lVar26 < lVar27 + -0xf;
      lVar26 = lVar40;
    } while (bVar3);
  }
  if ((int)((uint)lVar40 | 3) < max_jj) {
    lVar26 = (long)(iVar2 * k);
    lVar32 = (long)(int)(uint)lVar40;
    lVar40 = lVar32 + lVar37;
    lVar38 = lVar40 * 0x40 + lVar26 * 4 + 0xc0;
    lVar36 = lVar40 * 0x20 + lVar26 * 4 + 0x60;
    lVar42 = lVar40 * 0x10 + lVar26 * 4 + 0x30;
    lVar26 = lVar37 * 4 + lVar32 * 4 + lVar26 * 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar29 = (undefined1 (*) [64])((long)B->data + lVar38);
          iVar28 = 0xf;
          do {
            auVar45 = vunpcklps_avx512f(pauVar29[-3],pauVar29[-2]);
            auVar46 = vunpckhps_avx512f(pauVar29[-3],pauVar29[-2]);
            auVar47 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
            auVar48 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
            auVar49 = vunpcklpd_avx512f(auVar45,auVar47);
            auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
            auVar47 = vunpcklpd_avx512f(auVar46,auVar48);
            auVar46 = vunpckhpd_avx512f(auVar46,auVar48);
            auVar48 = vshuff64x2_avx512f(auVar49,auVar45,0x88);
            auVar50 = vshuff64x2_avx512f(auVar47,auVar46,0x88);
            auVar45 = vshuff64x2_avx512f(auVar49,auVar45,0xdd);
            auVar46 = vshuff64x2_avx512f(auVar47,auVar46,0xdd);
            auVar47 = vshuff64x2_avx512f(auVar48,auVar50,0x88);
            auVar49 = vshuff64x2_avx512f(auVar45,auVar46,0x88);
            auVar48 = vshuff64x2_avx512f(auVar48,auVar50,0xdd);
            auVar45 = vshuff64x2_avx512f(auVar45,auVar46,0xdd);
            BT->data = (void *)auVar47._0_8_;
            BT->refcount = (int *)auVar47._8_8_;
            BT->elemsize = auVar47._16_8_;
            BT->elempack = auVar47._24_4_;
            *(int *)&BT->field_0x1c = auVar47._28_4_;
            BT->allocator = (Allocator *)auVar47._32_8_;
            BT->dims = auVar47._40_4_;
            BT->w = auVar47._44_4_;
            BT->h = auVar47._48_4_;
            BT->d = auVar47._52_4_;
            BT->c = auVar47._56_4_;
            *(int *)&BT->field_0x3c = auVar47._60_4_;
            *(undefined1 (*) [64])&BT->cstep = auVar49;
            *(undefined1 (*) [64])&BT[1].c = auVar48;
            *(undefined1 (*) [64])&BT[2].h = auVar45;
            BT = (Mat *)&BT[3].dims;
            iVar28 = iVar28 + 0x10;
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
          } while (iVar28 < max_kk);
          goto LAB_004920a7;
        }
      }
      else {
LAB_004920a7:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_004921db;
          pauVar30 = (undefined1 (*) [32])((long)B->data + lVar36);
          iVar28 = 7;
          do {
            auVar19 = vunpcklps_avx(pauVar30[-3],pauVar30[-2]);
            auVar5 = vunpckhps_avx(pauVar30[-3],pauVar30[-2]);
            auVar8 = vunpcklps_avx(pauVar30[-1],*pauVar30);
            auVar6 = vunpckhps_avx(pauVar30[-1],*pauVar30);
            auVar7 = vunpcklpd_avx(auVar19,auVar8);
            auVar19 = vunpckhpd_avx(auVar19,auVar8);
            auVar8 = vunpcklpd_avx(auVar5,auVar6);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            auVar64 = auVar19._0_16_;
            auVar65 = auVar8._0_16_;
            auVar63 = auVar5._0_16_;
            auVar19 = vperm2f128_avx(auVar7,auVar19,0x31);
            auVar5 = vperm2f128_avx(auVar8,auVar5,0x31);
            BT->data = (void *)SUB168(auVar7._0_16_,0);
            BT->refcount = (int *)SUB168(auVar7._0_16_,8);
            BT->elemsize = auVar64._0_8_;
            BT->elempack = auVar64._8_4_;
            *(int *)&BT->field_0x1c = auVar64._12_4_;
            BT->allocator = (Allocator *)auVar65._0_8_;
            BT->dims = auVar65._8_4_;
            BT->w = auVar65._12_4_;
            BT->h = auVar63._0_4_;
            BT->d = auVar63._4_4_;
            BT->c = auVar63._8_4_;
            *(int *)&BT->field_0x3c = auVar63._12_4_;
            *(undefined1 (*) [32])&BT->cstep = auVar19;
            BT[1].elempack = auVar5._0_4_;
            *(int *)&BT[1].field_0x1c = auVar5._4_4_;
            BT[1].allocator = (Allocator *)auVar5._8_8_;
            BT[1].dims = auVar5._16_4_;
            BT[1].w = auVar5._20_4_;
            BT[1].h = auVar5._24_4_;
            BT[1].d = auVar5._28_4_;
            BT = (Mat *)&BT[1].c;
            iVar28 = iVar28 + 8;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + (long)(iVar2 * 8) * 4);
          } while (iVar28 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004921db;
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar42);
          iVar28 = 3;
          do {
            auVar63 = vunpcklps_avx(pauVar31[-3],pauVar31[-2]);
            auVar67 = vunpcklps_avx(pauVar31[-1],*pauVar31);
            auVar64 = vunpckhps_avx(pauVar31[-3],pauVar31[-2]);
            auVar65 = vunpckhps_avx(pauVar31[-1],*pauVar31);
            auVar66 = vunpcklpd_avx(auVar63,auVar67);
            auVar63 = vunpckhpd_avx(auVar63,auVar67);
            auVar67 = vunpcklpd_avx(auVar64,auVar65);
            auVar64 = vunpckhpd_avx(auVar64,auVar65);
            BT->data = (void *)auVar66._0_8_;
            BT->refcount = (int *)auVar66._8_8_;
            BT->elemsize = auVar63._0_8_;
            BT->elempack = auVar63._8_4_;
            *(int *)&BT->field_0x1c = auVar63._12_4_;
            BT->allocator = (Allocator *)auVar67._0_8_;
            BT->dims = auVar67._8_4_;
            BT->w = auVar67._12_4_;
            BT->h = auVar64._0_4_;
            BT->d = auVar64._4_4_;
            BT->c = auVar64._8_4_;
            *(int *)&BT->field_0x3c = auVar64._12_4_;
            BT = (Mat *)&BT->cstep;
            iVar28 = iVar28 + 4;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)(iVar2 * 4) * 4);
          } while (iVar28 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar26);
          iVar28 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + lVar35 * 4);
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
      }
LAB_004921db:
      lVar40 = lVar32 + 4;
      lVar39 = lVar32 + 7;
      lVar38 = lVar38 + 0x100;
      lVar36 = lVar36 + 0x80;
      lVar42 = lVar42 + 0x40;
      lVar26 = lVar26 + 0x10;
      lVar32 = lVar40;
    } while (lVar39 < lVar27);
  }
  if ((int)((uint)lVar40 | 1) < max_jj) {
    lVar42 = (long)(iVar2 * k);
    lVar26 = (long)(int)(uint)lVar40;
    lVar40 = lVar26 + lVar37;
    lVar36 = lVar40 * 0x40 + lVar42 * 4 + 0x40;
    lVar32 = lVar40 * 0x20 + lVar42 * 4 + 0x20;
    lVar38 = lVar40 * 0x10 + lVar42 * 4 + 0x10;
    lVar42 = lVar37 * 4 + lVar26 * 4 + lVar42 * 4 + 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar29 = (undefined1 (*) [64])((long)B->data + lVar36);
          iVar28 = 0xf;
          do {
            auVar45 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
            auVar46 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
            auVar47 = vshuff64x2_avx512f(auVar45,auVar46,0x88);
            auVar45 = vshuff64x2_avx512f(auVar45,auVar46,0xdd);
            auVar46 = vshuff64x2_avx512f(auVar47,auVar45,0x88);
            auVar45 = vshuff64x2_avx512f(auVar47,auVar45,0xdd);
            BT->data = (void *)auVar46._0_8_;
            BT->refcount = (int *)auVar46._8_8_;
            BT->elemsize = auVar46._16_8_;
            BT->elempack = auVar46._24_4_;
            *(int *)&BT->field_0x1c = auVar46._28_4_;
            BT->allocator = (Allocator *)auVar46._32_8_;
            BT->dims = auVar46._40_4_;
            BT->w = auVar46._44_4_;
            BT->h = auVar46._48_4_;
            BT->d = auVar46._52_4_;
            BT->c = auVar46._56_4_;
            *(int *)&BT->field_0x3c = auVar46._60_4_;
            *(undefined1 (*) [64])&BT->cstep = auVar45;
            BT = (Mat *)&BT[1].c;
            iVar28 = iVar28 + 0x10;
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
          } while (iVar28 < max_kk);
          goto LAB_0049232c;
        }
      }
      else {
LAB_0049232c:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_004923fd;
          pauVar30 = (undefined1 (*) [32])((long)B->data + lVar32);
          iVar28 = 7;
          do {
            auVar5 = vunpcklps_avx(pauVar30[-1],*pauVar30);
            auVar19 = vunpckhps_avx(pauVar30[-1],*pauVar30);
            auVar63 = auVar19._0_16_;
            auVar19 = vperm2f128_avx(auVar5,auVar19,0x31);
            BT->data = (void *)SUB168(auVar5._0_16_,0);
            BT->refcount = (int *)SUB168(auVar5._0_16_,8);
            BT->elemsize = auVar63._0_8_;
            BT->elempack = auVar63._8_4_;
            *(int *)&BT->field_0x1c = auVar63._12_4_;
            BT->allocator = (Allocator *)auVar19._0_8_;
            BT->dims = auVar19._8_4_;
            BT->w = auVar19._12_4_;
            BT->h = auVar19._16_4_;
            BT->d = auVar19._20_4_;
            BT->c = auVar19._24_4_;
            *(int *)&BT->field_0x3c = auVar19._28_4_;
            BT = (Mat *)&BT->cstep;
            iVar28 = iVar28 + 8;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + (long)(iVar2 * 8) * 4);
          } while (iVar28 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_004923fd;
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar38);
          iVar28 = 3;
          do {
            auVar64 = vunpcklps_avx(pauVar31[-1],*pauVar31);
            auVar63 = vunpckhps_avx(pauVar31[-1],*pauVar31);
            BT->data = (void *)auVar64._0_8_;
            BT->refcount = (int *)auVar64._8_8_;
            BT->elemsize = auVar63._0_8_;
            BT->elempack = auVar63._8_4_;
            *(int *)&BT->field_0x1c = auVar63._12_4_;
            BT = (Mat *)&BT->allocator;
            iVar28 = iVar28 + 4;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)(iVar2 * 4) * 4);
          } while (iVar28 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar33 = (undefined4 *)((long)B->data + lVar42);
          iVar28 = max_kk;
          do {
            *(undefined4 *)&BT->data = puVar33[-1];
            *(undefined4 *)((long)&BT->data + 4) = *puVar33;
            BT = (Mat *)&BT->refcount;
            puVar33 = puVar33 + lVar35;
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
      }
LAB_004923fd:
      lVar40 = lVar26 + 2;
      lVar39 = lVar26 + 3;
      lVar36 = lVar36 + 0x80;
      lVar32 = lVar32 + 0x40;
      lVar38 = lVar38 + 0x20;
      lVar42 = lVar42 + 8;
      lVar26 = lVar40;
    } while (lVar39 < lVar27);
  }
  if ((int)lVar40 < max_jj) {
    lVar38 = (long)(k * iVar2);
    lVar36 = (long)(int)lVar40;
    lVar40 = lVar36 + lVar37;
    lVar26 = lVar40 * 0x40 + lVar38 * 4;
    lVar32 = lVar40 * 0x20 + lVar38 * 4;
    lVar40 = lVar40 * 0x10 + lVar38 * 4;
    lVar37 = lVar38 * 4 + lVar37 * 4 + lVar36 * 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar29 = (undefined1 (*) [64])((long)B->data + lVar26);
          iVar28 = 0xf;
          do {
            *(undefined1 (*) [64])BT = *pauVar29;
            BT = (Mat *)&BT->cstep;
            iVar28 = iVar28 + 0x10;
            pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
          } while (iVar28 < max_kk);
          goto LAB_004924f1;
        }
      }
      else {
LAB_004924f1:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_00492588;
          pauVar30 = (undefined1 (*) [32])((long)B->data + lVar32);
          iVar28 = 7;
          do {
            *(undefined1 (*) [32])BT = *pauVar30;
            BT = (Mat *)&BT->allocator;
            iVar28 = iVar28 + 8;
            pauVar30 = (undefined1 (*) [32])(*pauVar30 + (long)(iVar2 * 8) * 4);
          } while (iVar28 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_00492588;
          pauVar31 = (undefined1 (*) [16])((long)B->data + lVar40);
          iVar28 = 3;
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            iVar28 = iVar28 + 4;
            pauVar31 = (undefined1 (*) [16])(*pauVar31 + (long)(iVar2 * 4) * 4);
          } while (iVar28 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar33 = (undefined4 *)((long)B->data + lVar37);
          iVar28 = max_kk;
          do {
            *(undefined4 *)&BT->data = *puVar33;
            BT = (Mat *)((long)&BT->data + 4);
            puVar33 = puVar33 + lVar35;
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
      }
LAB_00492588:
      lVar36 = lVar36 + 1;
      lVar26 = lVar26 + 0x40;
      lVar32 = lVar32 + 0x20;
      lVar40 = lVar40 + 0x10;
      lVar37 = lVar37 + 4;
    } while (lVar36 != lVar27);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}